

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O1

unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
 __thiscall anon_unknown.dwarf_5250::testImageFilebuf(anon_unknown_dwarf_5250 *this,string *name)

{
  char cVar1;
  filebuf *this_00;
  filebuf *pfVar2;
  string imagePath;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,(anonymous_namespace)::testImagesPath_abi_cxx11_,
             DAT_001545e8 + (anonymous_namespace)::testImagesPath_abi_cxx11_);
  std::__cxx11::string::push_back((char)(string *)local_40);
  std::__cxx11::string::_M_append((char *)local_40,(ulong)(name->_M_dataplus)._M_p);
  this_00 = (filebuf *)operator_new(0xf0);
  std::filebuf::filebuf(this_00);
  std::filebuf::open((char *)this_00,(_Ios_Openmode)local_40[0]);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    *(undefined8 *)this = 0;
    pfVar2 = (filebuf *)0x0;
  }
  else {
    pfVar2 = this_00;
    this_00 = (filebuf *)0x0;
  }
  *(filebuf **)this = pfVar2;
  if (this_00 != (filebuf *)0x0) {
    (**(code **)(*(long *)this_00 + 8))(this_00);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return (__uniq_ptr_data<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::streambuf> testImageFilebuf(std::string name)
{
    std::string imagePath{testImagesPath};
    imagePath += '/';
    imagePath += name;
    
    auto filebuf = std::make_unique<std::filebuf>();
    filebuf->open(imagePath, std::ios::in | std::ios::binary);
    if (filebuf->is_open())
    {
        return filebuf;
    }
    return nullptr;
}